

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_switch(Parser *parser)

{
  Kind KVar1;
  uint row;
  uint col;
  Token *name;
  Token *pTVar2;
  char *file;
  List *list;
  BlockStmt *defexpr;
  void *block;
  CaseStmt *data;
  BlockStmt *data_00;
  List *pLVar3;
  void *pvVar4;
  ConstantTerm *expr;
  SwitchStmt *pSVar5;
  KindMeta KVar6;
  
  expect(parser,SWITCH);
  name = parser->token;
  expect(parser,ID);
  expect(parser,OP_FL_BRA);
  list = new_list();
  defexpr = (BlockStmt *)0x0;
  do {
    KVar1 = parser->token->kind;
    if (KVar1 == END) {
      expect(parser,CL_FL_BRA);
    }
    else if (KVar1 == CL_FL_BRA) {
      expect(parser,CL_FL_BRA);
      expr = new_constant_term(name);
      pSVar5 = new_switch_stmt(expr,list,defexpr);
      return pSVar5;
    }
    if (defexpr != (BlockStmt *)0x0) {
      log_debug(
               "/workspace/llm4binary/github/license_all_cmakelists_25/editso[P]timely-lang/parser.c:407"
               );
      pTVar2 = parser->token;
      file = parser->lexer->source;
      row = pTVar2->row_pos;
      col = pTVar2->col_pos;
      KVar6 = get_kind_meta(pTVar2->kind);
      log_code(file,row,col,"Invalid statement: %s",KVar6.name);
    }
    move(parser);
    KVar1 = parser->token->kind;
    if (KVar1 == CASE) {
      expect(parser,CASE);
      pvVar4 = parse_constant(parser);
      expect(parser,COLON);
      if (parser->token->kind == OP_FL_BRA) {
        block = parse_block(parser);
        data = new_case_stmt(pvVar4,block);
        list_add(list,data);
      }
      else {
        pLVar3 = new_list();
        while ((KVar1 = parser->token->kind, 1 < KVar1 - CASE && (KVar1 != CL_FL_BRA))) {
          pvVar4 = parse_stmt(parser);
          list_add(pLVar3,pvVar4);
          move(parser);
        }
        data_00 = new_block_stmt(pLVar3);
        list_add(list,data_00);
        stack_push(parser->stack,parser->token);
      }
    }
    else if (KVar1 == DEFAULT) {
      move(parser);
      expect(parser,COLON);
      if (parser->token->kind == OP_FL_BRA) {
        defexpr = (BlockStmt *)parse_block(parser);
      }
      else {
        pLVar3 = new_list();
        while (((KVar1 = parser->token->kind, KVar1 != CL_FL_BRA && (KVar1 != END)) &&
               (KVar1 != CASE))) {
          pvVar4 = parse_stmt(parser);
          list_add(pLVar3,pvVar4);
          move(parser);
        }
        defexpr = new_block_stmt(pLVar3);
      }
    }
  } while( true );
}

Assistant:

void *parse_switch(Parser *parser) {
    expect(parser, SWITCH);
    Token *id = token(parser);
//    out_token(token(parser));
    expect(parser, ID);
    expect(parser, OP_FL_BRA);
    List *case_stmt = new_list();
    List *block;
    void *def_expr = NULL;
    while (token(parser)->kind != CL_FL_BRA) {
        if (token(parser)->kind == END) {
            expect(parser, CL_FL_BRA);
        }
        if (def_expr != NULL) {
            parse_error(parser, "Invalid statement: %s", get_kind_meta(token(parser)->kind).name);
        }
        move(parser);
        if (token(parser)->kind == CASE) {
            expect(parser, CASE);
            void *constant = parse_constant(parser);
            expect(parser, COLON);
            if (token(parser)->kind == OP_FL_BRA) {
                list_add(case_stmt, new_case_stmt(constant, parse_block(parser)));
            } else {
                block = new_list();
                while (true) {
                    if (token(parser)->kind == CASE ||
                        token(parser)->kind == DEFAULT ||
                        token(parser)->kind == CL_FL_BRA)
                        break;
                    list_add(block, parse_stmt(parser));
                    move(parser);
                }
                list_add(case_stmt, new_block_stmt(block));
                push(parser, token(parser));
            }
        } else if (token(parser)->kind == DEFAULT) {
            move(parser);
            expect(parser, COLON);
            if (token(parser)->kind == OP_FL_BRA) {
                def_expr = parse_block(parser);
            } else {
                block = new_list();
                while (token(parser)->kind != END &&
                       token(parser)->kind != CL_FL_BRA &&
                       token(parser)->kind != CASE) {
                    list_add(block, parse_stmt(parser));
                    move(parser);
                }
                def_expr = new_block_stmt(block);
            }
        }
    }
    expect(parser, CL_FL_BRA);
    return new_switch_stmt(new_constant_term(id), case_stmt, def_expr);
}